

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_bind.cpp
# Opt level: O0

void __thiscall FKeyBindings::PerformBind(FKeyBindings *this,FCommandLine *argv,char *msg)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  int local_24;
  int i;
  char *msg_local;
  FCommandLine *argv_local;
  FKeyBindings *this_local;
  
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 < 2) {
    Printf("%s:\n",msg);
    for (local_24 = 0; local_24 < 0x1c4; local_24 = local_24 + 1) {
      bVar1 = FString::IsEmpty(this->Binds + local_24);
      if (!bVar1) {
        pcVar4 = KeyName(local_24);
        pcVar5 = FString::GetChars(this->Binds + local_24);
        Printf("%s \"%s\"\n",pcVar4,pcVar5);
      }
    }
  }
  else {
    pcVar4 = FCommandLine::operator[](argv,1);
    iVar2 = GetKeyFromName(pcVar4);
    if (iVar2 == 0) {
      pcVar4 = FCommandLine::operator[](argv,1);
      Printf("Unknown key \"%s\"\n",pcVar4);
    }
    else {
      iVar3 = FCommandLine::argc(argv);
      if (iVar3 == 2) {
        pcVar4 = FCommandLine::operator[](argv,1);
        pcVar5 = FString::GetChars(this->Binds + iVar2);
        Printf("\"%s\" = \"%s\"\n",pcVar4,pcVar5);
      }
      else {
        pcVar4 = FCommandLine::operator[](argv,2);
        FString::operator=(this->Binds + iVar2,pcVar4);
      }
    }
  }
  return;
}

Assistant:

void FKeyBindings::PerformBind(FCommandLine &argv, const char *msg)
{
	int i;

	if (argv.argc() > 1)
	{
		i = GetKeyFromName (argv[1]);
		if (!i)
		{
			Printf ("Unknown key \"%s\"\n", argv[1]);
			return;
		}
		if (argv.argc() == 2)
		{
			Printf ("\"%s\" = \"%s\"\n", argv[1], Binds[i].GetChars());
		}
		else
		{
			Binds[i] = argv[2];
		}
	}
	else
	{
		Printf ("%s:\n", msg);
		
		for (i = 0; i < NUM_KEYS; i++)
		{
			if (!Binds[i].IsEmpty())
				Printf ("%s \"%s\"\n", KeyName (i), Binds[i].GetChars());
		}
	}
}